

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_buf.c
# Opt level: O2

ssize_t tnt_buf_writev(tnt_stream *s,iovec *iov,int count)

{
  long *plVar1;
  void *__dest;
  ulong uVar2;
  long lVar3;
  ssize_t sVar4;
  ulong uVar5;
  
  sVar4 = -1;
  if (*(int *)((long)s->data + 0x38) != 1) {
    uVar2 = 0;
    uVar5 = (ulong)(uint)count;
    if (count < 1) {
      uVar5 = uVar2;
    }
    lVar3 = 0;
    for (; uVar5 * 0x10 != uVar2; uVar2 = uVar2 + 0x10) {
      lVar3 = lVar3 + *(long *)((long)&iov->iov_len + uVar2);
    }
    __dest = (void *)(**(code **)((long)s->data + 0x20))(s,lVar3);
    if (__dest != (void *)0x0) {
      for (uVar2 = 0; uVar5 * 0x10 != uVar2; uVar2 = uVar2 + 0x10) {
        memcpy(__dest,*(void **)((long)&iov->iov_base + uVar2),
               *(size_t *)((long)&iov->iov_len + uVar2));
        __dest = (void *)((long)__dest + *(long *)((long)&iov->iov_len + uVar2));
      }
      plVar1 = (long *)((long)s->data + 8);
      *plVar1 = *plVar1 + lVar3;
      s->wrcnt = s->wrcnt + 1;
      sVar4 = lVar3;
    }
  }
  return sVar4;
}

Assistant:

static ssize_t
tnt_buf_writev(struct tnt_stream *s, struct iovec *iov, int count) {
	if (TNT_SBUF_CAST(s)->as == 1) return -1;
	size_t size = 0;
	int i;
	for (i = 0 ; i < count ; i++)
		size += iov[i].iov_len;
	char *p = TNT_SBUF_CAST(s)->resize(s, size);
	if (p == NULL)
		return -1;
	for (i = 0 ; i < count ; i++) {
		memcpy(p, iov[i].iov_base, iov[i].iov_len);
		p += iov[i].iov_len;
	}
	TNT_SBUF_CAST(s)->size += size;
	s->wrcnt++;
	return size;
}